

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>::fastAccessDx
          (value_type *__return_storage_ptr__,
          FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_> *this,int i)

{
  int iVar1;
  Fad<double> *pFVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  
  pFVar2 = (this->right_->dx_).ptr_to_data;
  __return_storage_ptr__->val_ = -pFVar2[i].val_;
  iVar1 = pFVar2[i].dx_.num_elts;
  lVar6 = (long)iVar1;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (lVar6 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = iVar1;
    pdVar4 = (double *)operator_new__(lVar6 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar4;
    __return_storage_ptr__->defaultVal = 0.0;
    pdVar3 = pFVar2[i].dx_.ptr_to_data;
    lVar5 = 0;
    do {
      pdVar4[lVar5] = -pdVar3[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return - right_.fastAccessDx(i);}